

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum2.pb.cc
# Opt level: O0

size_t __thiscall proto2_preserve_unknown_enum_unittest::MyMessage::ByteSizeLong(MyMessage *this)

{
  int iVar1;
  MyEnum MVar2;
  OCase OVar3;
  RepeatedField<int> *pRVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  uint32_t *puVar10;
  size_t tag_size_1;
  size_t data_size_1;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  MyMessage *this_;
  MyMessage *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar4 = _internal_repeated_e(this);
  sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar4);
  iVar1 = _internal_repeated_e_size(this);
  sVar6 = google::protobuf::internal::FromIntSize(iVar1);
  pRVar4 = _internal_repeated_packed_e(this);
  sVar7 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (pRVar4,1,&(this->field_0)._impl_._repeated_packed_e_cached_byte_size_);
  pRVar4 = _internal_repeated_packed_unexpected_e(this);
  sVar8 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar4);
  iVar1 = _internal_repeated_packed_unexpected_e_size(this);
  sVar9 = google::protobuf::internal::FromIntSize(iVar1);
  sStack_58 = sVar8 + sVar9 + sVar7 + sVar5 + sVar6;
  puVar10 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0)
  ;
  if ((*puVar10 & 1) != 0) {
    MVar2 = _internal_e(this);
    sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(MVar2);
    sStack_58 = sVar5 + 1 + sStack_58;
  }
  OVar3 = o_case(this);
  if (OVar3 != O_NOT_SET) {
    if (OVar3 == kOneofE1) {
      MVar2 = _internal_oneof_e_1(this);
      sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(MVar2);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    else if (OVar3 == kOneofE2) {
      MVar2 = _internal_oneof_e_2(this);
      sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(MVar2);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t MyMessage::ByteSizeLong() const {
  const MyMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_preserve_unknown_enum_unittest.MyMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_e = 2;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_e());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_e_size());
      total_size += data_size + tag_size;
    }
    // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_packed_e = 3 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_packed_e(), 1, this_._impl_._repeated_packed_e_cached_byte_size_);
    }
    // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_packed_unexpected_e = 4;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_packed_unexpected_e());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_packed_unexpected_e_size());
      total_size += data_size + tag_size;
    }
  }
   {
    // .proto2_preserve_unknown_enum_unittest.MyEnum e = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_e());
    }
  }
  switch (this_.o_case()) {
    // .proto2_preserve_unknown_enum_unittest.MyEnum oneof_e_1 = 5;
    case kOneofE1: {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_oneof_e_1());
      break;
    }
    // .proto2_preserve_unknown_enum_unittest.MyEnum oneof_e_2 = 6;
    case kOneofE2: {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_oneof_e_2());
      break;
    }
    case O_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}